

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_tests.cpp
# Opt level: O2

void __thiscall
omp_range_simple_case_three_overload_Test::TestBody(omp_range_simple_case_three_overload_Test *this)

{
  bool bVar1;
  char *message;
  initializer_list<long> __l;
  value_type v;
  const_iterator __end1;
  const_iterator __begin1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  vector<long,_std::allocator<long>_> expecting;
  vector<long,_std::allocator<long>_> result;
  
  result.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3;
  result.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  result.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2;
  __l._M_len = 5;
  __l._M_array = (iterator)&result;
  std::vector<long,_std::allocator<long>_>::vector(&expecting,__l,(allocator_type *)&__begin1);
  result.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  result.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  __begin1.step_ = 1;
  __begin1.value_ = 1;
  __end1 = (const_iterator)&DAT_600000001;
  while( true ) {
    bVar1 = omp::details::range_iterator<int>::operator!=(&__begin1,&__end1);
    if (!bVar1) break;
    v = __begin1.value_;
    std::vector<long,std::allocator<long>>::emplace_back<int&>
              ((vector<long,std::allocator<long>> *)&result,&v);
    __begin1.value_ = __begin1.value_ + __begin1.step_;
  }
  testing::internal::
  CmpHelperEQ<std::vector<long,std::allocator<long>>,std::vector<long,std::allocator<long>>>
            ((internal *)&__begin1,"result","expecting",&result,&expecting);
  if ((char)__begin1.step_ == '\0') {
    testing::Message::Message((Message *)&__end1);
    if (local_68._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_68._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&v,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/range_tests.cpp"
               ,0x3a,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&v,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&v);
    if (__end1 != (const_iterator)0x0) {
      (**(code **)(*(long *)__end1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&result.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&expecting.super__Vector_base<long,_std::allocator<long>_>);
  return;
}

Assistant:

TEST(omp_range, simple_case_three_overload) {
  const std::vector<std::int64_t> expecting = {1, 2, 3, 4, 5};

  std::vector<std::int64_t> result;

  for (auto v : omp::range(1, 6))
    result.emplace_back(v);

  ASSERT_EQ(result, expecting);
}